

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void cleanup_realm(void)

{
  magic_realm *pmVar1;
  magic_realm *next;
  magic_realm *p;
  
  next = realms;
  while (next != (magic_realm *)0x0) {
    pmVar1 = next->next;
    string_free(next->name);
    string_free(next->verb);
    string_free(next->spell_noun);
    string_free(next->book_noun);
    mem_free(next);
    next = pmVar1;
  }
  return;
}

Assistant:

static void cleanup_realm(void)
{
	struct magic_realm *p = realms;
	struct magic_realm *next;

	while (p) {
		next = p->next;
		string_free(p->name);
		string_free(p->verb);
		string_free(p->spell_noun);
		string_free(p->book_noun);
		mem_free(p);
		p = next;
	}
}